

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::str_writer<char>>
          (basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          str_writer<char> *f)

{
  wchar_t wVar1;
  size_t sVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  int *piVar8;
  wchar_t __tmp;
  size_t sVar9;
  long lVar10;
  long lVar11;
  size_t size_1;
  size_t sVar12;
  byte bVar13;
  ulong uVar14;
  long lVar15;
  char *pcVar16;
  buffer<wchar_t> *c;
  ulong uVar17;
  size_t size;
  ulong uVar18;
  int iVar24;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar31;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  uVar14 = (ulong)(uint)specs->width;
  sVar2 = f->size_;
  sVar12 = sVar2;
  if (uVar14 != 0) {
    if (sVar2 == 0) {
      sVar12 = 0;
    }
    else {
      sVar12 = 0;
      sVar9 = 0;
      do {
        sVar12 = sVar12 + 1;
        sVar9 = sVar9 + 1;
      } while (sVar2 != sVar9);
    }
  }
  puVar3 = *(undefined8 **)this;
  lVar10 = puVar3[2];
  uVar17 = uVar14 - sVar12;
  if (uVar14 < sVar12 || uVar17 == 0) {
    uVar14 = sVar2 + lVar10;
    if ((ulong)puVar3[3] < uVar14) {
      (**(code **)*puVar3)(puVar3,uVar14);
    }
    puVar3[2] = uVar14;
    if (0 < (long)f->size_) {
      lVar15 = puVar3[1];
      pcVar16 = f->s;
      lVar7 = f->size_ + 1;
      lVar11 = 0;
      do {
        *(int *)(lVar10 * 4 + lVar15 + lVar11 * 4) = (int)pcVar16[lVar11];
        lVar7 = lVar7 + -1;
        lVar11 = lVar11 + 1;
      } while (1 < lVar7);
    }
  }
  else {
    uVar18 = ((sVar2 + uVar14) - sVar12) + lVar10;
    if ((ulong)puVar3[3] < uVar18) {
      (**(code **)*puVar3)(puVar3,uVar18);
    }
    puVar3[2] = uVar18;
    auVar6 = _DAT_01df1090;
    auVar5 = _DAT_01df1070;
    auVar4 = _DAT_01de8e80;
    lVar15 = puVar3[1];
    piVar8 = (int *)(lVar15 + lVar10 * 4);
    wVar1 = (specs->fill).data_[0];
    bVar13 = specs->field_0x9 & 0xf;
    if (bVar13 == 3) {
      uVar18 = uVar17 >> 1;
      if (1 < uVar17) {
        piVar8 = piVar8 + uVar18;
        uVar17 = uVar18 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar29._8_4_ = (int)uVar17;
        auVar29._0_8_ = uVar17;
        auVar29._12_4_ = (int)(uVar17 >> 0x20);
        lVar15 = lVar15 + lVar10 * 4;
        lVar10 = 0;
        auVar29 = auVar29 ^ _DAT_01de8e80;
        do {
          auVar26._8_4_ = (int)lVar10;
          auVar26._0_8_ = lVar10;
          auVar26._12_4_ = (int)((ulong)lVar10 >> 0x20);
          auVar30 = (auVar26 | auVar5) ^ auVar4;
          iVar24 = auVar29._4_4_;
          if ((bool)(~(auVar30._4_4_ == iVar24 && auVar29._0_4_ < auVar30._0_4_ ||
                      iVar24 < auVar30._4_4_) & 1)) {
            *(wchar_t *)(lVar15 + lVar10 * 4) = wVar1;
          }
          if ((auVar30._12_4_ != auVar29._12_4_ || auVar30._8_4_ <= auVar29._8_4_) &&
              auVar30._12_4_ <= auVar29._12_4_) {
            *(wchar_t *)(lVar15 + 4 + lVar10 * 4) = wVar1;
          }
          auVar26 = (auVar26 | auVar6) ^ auVar4;
          iVar31 = auVar26._4_4_;
          if (iVar31 <= iVar24 && (iVar31 != iVar24 || auVar26._0_4_ <= auVar29._0_4_)) {
            *(wchar_t *)(lVar15 + 8 + lVar10 * 4) = wVar1;
            *(wchar_t *)(lVar15 + 0xc + lVar10 * 4) = wVar1;
          }
          lVar10 = lVar10 + 4;
        } while ((uVar17 - ((uint)(uVar18 + 0x3fffffffffffffff) & 3)) + 4 != lVar10);
      }
      if (0 < (long)f->size_) {
        pcVar16 = f->s;
        lVar10 = f->size_ + 1;
        do {
          *piVar8 = (int)*pcVar16;
          pcVar16 = pcVar16 + 1;
          piVar8 = piVar8 + 1;
          lVar10 = lVar10 + -1;
        } while (1 < lVar10);
      }
      auVar6 = _DAT_01df1090;
      auVar5 = _DAT_01df1070;
      auVar4 = _DAT_01de8e80;
      if (uVar14 != sVar12) {
        uVar17 = (uVar14 * 4 + (sVar12 + uVar18) * -4) - 4;
        auVar30._8_4_ = (int)uVar17;
        auVar30._0_8_ = uVar17;
        auVar30._12_4_ = (int)(uVar17 >> 0x20);
        auVar21._0_8_ = uVar17 >> 2;
        auVar21._8_8_ = auVar30._8_8_ >> 2;
        uVar14 = 0;
        auVar21 = auVar21 ^ _DAT_01de8e80;
        do {
          auVar27._8_4_ = (int)uVar14;
          auVar27._0_8_ = uVar14;
          auVar27._12_4_ = (int)(uVar14 >> 0x20);
          auVar29 = (auVar27 | auVar5) ^ auVar4;
          iVar24 = auVar21._4_4_;
          if ((bool)(~(auVar29._4_4_ == iVar24 && auVar21._0_4_ < auVar29._0_4_ ||
                      iVar24 < auVar29._4_4_) & 1)) {
            piVar8[uVar14] = wVar1;
          }
          if ((auVar29._12_4_ != auVar21._12_4_ || auVar29._8_4_ <= auVar21._8_4_) &&
              auVar29._12_4_ <= auVar21._12_4_) {
            piVar8[uVar14 + 1] = wVar1;
          }
          auVar29 = (auVar27 | auVar6) ^ auVar4;
          iVar31 = auVar29._4_4_;
          if (iVar31 <= iVar24 && (iVar31 != iVar24 || auVar29._0_4_ <= auVar21._0_4_)) {
            piVar8[uVar14 + 2] = wVar1;
            piVar8[uVar14 + 3] = wVar1;
          }
          uVar14 = uVar14 + 4;
        } while (((uVar17 >> 2) + 4 & 0xfffffffffffffffc) != uVar14);
      }
    }
    else if (bVar13 == 2) {
      if (uVar14 != sVar12) {
        piVar8 = piVar8 + uVar17;
        uVar17 = (uVar14 * 4 + sVar12 * -4) - 4;
        auVar19._8_4_ = (int)uVar17;
        auVar19._0_8_ = uVar17;
        auVar19._12_4_ = (int)(uVar17 >> 0x20);
        auVar20._0_8_ = uVar17 >> 2;
        auVar20._8_8_ = auVar19._8_8_ >> 2;
        lVar15 = lVar15 + lVar10 * 4;
        uVar14 = 0;
        auVar20 = auVar20 ^ _DAT_01de8e80;
        do {
          auVar25._8_4_ = (int)uVar14;
          auVar25._0_8_ = uVar14;
          auVar25._12_4_ = (int)(uVar14 >> 0x20);
          auVar29 = (auVar25 | auVar5) ^ auVar4;
          iVar24 = auVar20._4_4_;
          if ((bool)(~(auVar29._4_4_ == iVar24 && auVar20._0_4_ < auVar29._0_4_ ||
                      iVar24 < auVar29._4_4_) & 1)) {
            *(wchar_t *)(lVar15 + uVar14 * 4) = wVar1;
          }
          if ((auVar29._12_4_ != auVar20._12_4_ || auVar29._8_4_ <= auVar20._8_4_) &&
              auVar29._12_4_ <= auVar20._12_4_) {
            *(wchar_t *)(lVar15 + 4 + uVar14 * 4) = wVar1;
          }
          auVar29 = (auVar25 | auVar6) ^ auVar4;
          iVar31 = auVar29._4_4_;
          if (iVar31 <= iVar24 && (iVar31 != iVar24 || auVar29._0_4_ <= auVar20._0_4_)) {
            *(wchar_t *)(lVar15 + 8 + uVar14 * 4) = wVar1;
            *(wchar_t *)(lVar15 + 0xc + uVar14 * 4) = wVar1;
          }
          uVar14 = uVar14 + 4;
        } while (((uVar17 >> 2) + 4 & 0xfffffffffffffffc) != uVar14);
      }
      if (0 < (long)f->size_) {
        pcVar16 = f->s;
        lVar10 = f->size_ + 1;
        lVar15 = 0;
        do {
          piVar8[lVar15] = (int)pcVar16[lVar15];
          lVar10 = lVar10 + -1;
          lVar15 = lVar15 + 1;
        } while (1 < lVar10);
      }
    }
    else {
      if (0 < (long)f->size_) {
        pcVar16 = f->s;
        lVar10 = f->size_ + 1;
        do {
          *piVar8 = (int)*pcVar16;
          pcVar16 = pcVar16 + 1;
          piVar8 = piVar8 + 1;
          lVar10 = lVar10 + -1;
        } while (1 < lVar10);
      }
      auVar6 = _DAT_01df1090;
      auVar5 = _DAT_01df1070;
      auVar4 = _DAT_01de8e80;
      if (uVar14 != sVar12) {
        uVar17 = (uVar14 * 4 + sVar12 * -4) - 4;
        auVar22._8_4_ = (int)uVar17;
        auVar22._0_8_ = uVar17;
        auVar22._12_4_ = (int)(uVar17 >> 0x20);
        auVar23._0_8_ = uVar17 >> 2;
        auVar23._8_8_ = auVar22._8_8_ >> 2;
        uVar14 = 0;
        auVar23 = auVar23 ^ _DAT_01de8e80;
        do {
          auVar28._8_4_ = (int)uVar14;
          auVar28._0_8_ = uVar14;
          auVar28._12_4_ = (int)(uVar14 >> 0x20);
          auVar29 = (auVar28 | auVar5) ^ auVar4;
          iVar24 = auVar23._4_4_;
          if ((bool)(~(auVar29._4_4_ == iVar24 && auVar23._0_4_ < auVar29._0_4_ ||
                      iVar24 < auVar29._4_4_) & 1)) {
            piVar8[uVar14] = wVar1;
          }
          if ((auVar29._12_4_ != auVar23._12_4_ || auVar29._8_4_ <= auVar23._8_4_) &&
              auVar29._12_4_ <= auVar23._12_4_) {
            piVar8[uVar14 + 1] = wVar1;
          }
          auVar29 = (auVar28 | auVar6) ^ auVar4;
          iVar31 = auVar29._4_4_;
          if (iVar31 <= iVar24 && (iVar31 != iVar24 || auVar29._0_4_ <= auVar23._0_4_)) {
            piVar8[uVar14 + 2] = wVar1;
            piVar8[uVar14 + 3] = wVar1;
          }
          uVar14 = uVar14 + 4;
        } while (((uVar17 >> 2) + 4 & 0xfffffffffffffffc) != uVar14);
      }
    }
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }